

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend(TPZGeoBlend<pzgeom::TPZGeoPoint> *this)

{
  TPZGeoPoint::TPZGeoPoint(&this->super_TPZGeoPoint,&PTR_PTR_016c4388);
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c4330;
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_016b1180;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x30);
  return;
}

Assistant:

TPZGeoBlend() : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                        TGeo() {
        }